

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O2

void __thiscall amrex::MFIter::~MFIter(MFIter *this)

{
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> this_00;
  
  depth = 0;
  this_00._M_head_impl =
       (this->m_fa)._M_t.
       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
       super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
  if (this_00._M_head_impl != (FabArrayBase *)0x0) {
    FabArrayBase::clearThisBD(this_00._M_head_impl,false);
  }
  std::unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>::~unique_ptr
            (&this->m_fa);
  return;
}

Assistant:

MFIter::~MFIter ()
{
#ifdef AMREX_USE_OMP
#pragma omp master
#endif
    {
        depth = 0;
    }

#ifdef BL_USE_TEAM
    if ( ! (flags & NoTeamBarrier) )
        ParallelDescriptor::MyTeam().MemoryBarrier();
#endif

#ifdef AMREX_USE_GPU
    if (device_sync) Gpu::streamSynchronizeAll();
#endif

#ifdef AMREX_USE_GPU
    AMREX_GPU_ERROR_CHECK();
    Gpu::Device::resetStreamIndex();
#endif

    if (m_fa) {
#ifdef AMREX_USE_OMP
#pragma omp barrier
#pragma omp single
#endif
        m_fa->clearThisBD();
    }
}